

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O3

void lzham::vector<lzham::lzcompressor::lzdecision>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  lzdecision *pSrc;
  
  if (num != 0) {
    lVar1 = 0;
    do {
      *(undefined4 *)((long)pDst_void + lVar1 + 8) = *(undefined4 *)((long)pSrc_void + lVar1 + 8);
      *(undefined8 *)((long)pDst_void + lVar1) = *(undefined8 *)((long)pSrc_void + lVar1);
      lVar1 = lVar1 + 0xc;
    } while ((ulong)num * 0xc != lVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }